

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[257]>
    ::init(EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  process_attribute<pybind11::arg,_void> *in_R8;
  process_attribute<pybind11::arg,_void> *in_R9;
  process_attribute<pybind11::arg,_void> *in_stack_00000008;
  process_attribute<pybind11::arg,_void> *in_stack_00000010;
  undefined8 in_stack_00000018;
  EVP_PKEY_CTX *in_stack_00000020;
  
  *(undefined8 *)in_stack_00000020 = *(undefined8 *)ctx;
  uVar1 = *(ushort *)(in_stack_00000020 + 0x59);
  *(ushort *)(in_stack_00000020 + 0x59) = uVar1 | 0x10;
  *(undefined8 *)(in_stack_00000020 + 0x70) = *in_RSI;
  *(undefined8 *)(in_stack_00000020 + 0x78) = *in_RDX;
  *(ushort *)(in_stack_00000020 + 0x59) = uVar1 | 0x12;
  process_attribute<pybind11::arg,_void>::init(in_R8,in_stack_00000020);
  process_attribute<pybind11::arg,_void>::init(in_R9,in_stack_00000020);
  process_attribute<pybind11::arg,_void>::init(in_stack_00000008,in_stack_00000020);
  iVar2 = process_attribute<pybind11::arg,_void>::init(in_stack_00000010,in_stack_00000020);
  *(undefined8 *)(in_stack_00000020 + 8) = in_stack_00000018;
  return iVar2;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }